

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O0

void mult_verify::MultVerifyInt64Int64(void)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  int64_t ret;
  TestCase<long,_long,_0> test;
  TestVector<long,_long,_0> tests;
  long in_stack_ffffffffffffff28;
  allocator *in_stack_ffffffffffffff30;
  TestVector<long,_long,_0> *in_stack_ffffffffffffff40;
  byte local_a8;
  allocator local_99;
  string local_98 [32];
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_78;
  byte local_6d;
  allocator<char> local_59;
  string local_58 [7];
  undefined1 in_stack_ffffffffffffffaf;
  long in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  long local_30 [2];
  byte local_20;
  TestVector<long,_long,_0> local_18;
  
  TestVector<long,_long,_0>::TestVector(&local_18);
  TestVector<long,_long,_0>::GetNext(in_stack_ffffffffffffff40);
  while( true ) {
    bVar1 = TestVector<long,_long,_0>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeMultiply<long,long>
                      ((long)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(long *)0x1aee7e);
    if (bVar1 != (bool)(local_20 & 1)) {
      in_stack_ffffffffffffff40 = (TestVector<long,_long,_0> *)&local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_58,"Error in case int64_int64: ",(allocator *)in_stack_ffffffffffffff40);
      err_msg<long,long>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    local_6d = 1;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_78,local_30);
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if ((local_6d & 1) != (local_20 & 1)) {
      in_stack_ffffffffffffff30 = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,"Error in case int64_int64 throw: ",in_stack_ffffffffffffff30);
      err_msg<long,long>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    TestVector<long,_long,_0>::GetNext(in_stack_ffffffffffffff40);
    local_20 = local_a8;
  }
  return;
}

Assistant:

void MultVerifyInt64Int64()
{
	TestVector< std::int64_t, std::int64_t, OpType::Mult > tests;
	TestCase<std::int64_t, std::int64_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::int64_t ret;
		if( SafeMultiply(test.x, test.y, ret) != test.fExpected )
		{
			//assert(false);
			err_msg( "Error in case int64_int64: ", test.x, test.y, test.fExpected );
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::int64_t> si(test.x);
			si *= test.y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != test.fExpected )
		{
			err_msg( "Error in case int64_int64 throw: ", test.x, test.y, test.fExpected );
		}

		test = tests.GetNext();
	}
}